

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cpp
# Opt level: O3

bool __thiscall skiwi::anon_unknown_1::dump_visitor::_previsit(dump_visitor *this,Lambda *l)

{
  pointer pbVar1;
  ostream *poVar2;
  undefined1 *puVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v;
  pointer pbVar4;
  
  puVar3 = &this->field_0x18;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar3,"( lambda ( ",0xb);
  pbVar1 = (l->variables).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar4 = (l->variables).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1) {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar3,(pbVar4->_M_dataplus)._M_p,pbVar4->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar3,") ",2);
  return true;
}

Assistant:

virtual bool _previsit(Lambda& l)
      {
      str << "( lambda ( ";
      for (const auto& v : l.variables)
        str << v << " ";
      str << ") ";
      return true;
      }